

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_rescue(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_RDI;
  CHAR_DATA *in_stack_00000008;
  CHAR_DATA *fch;
  CHAR_DATA *victim;
  char arg [4608];
  undefined4 in_stack_ffffffffffffedc8;
  int in_stack_ffffffffffffedcc;
  undefined1 fBoth;
  undefined4 in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd4;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *ch_01;
  char *in_stack_ffffffffffffede0;
  char local_1218;
  int in_stack_ffffffffffffeea4;
  undefined1 in_stack_ffffffffffffeeab;
  int in_stack_ffffffffffffeeac;
  CHAR_DATA *in_stack_ffffffffffffeeb0;
  int in_stack_ffffffffffffeecc;
  CHAR_DATA *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
               (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
  }
  else {
    ch_00 = get_char_room(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char((char *)0x0,in_stack_ffffffffffffedd8);
    }
    else if (ch_00 == in_RDI) {
      send_to_char((char *)ch_00,in_stack_ffffffffffffedd8);
    }
    else {
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
      if ((bVar1) ||
         (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8))
         , !bVar1)) {
        ch_01 = ch_00->fighting;
        if (ch_01 == (CHAR_DATA *)0x0) {
          send_to_char((char *)ch_00,(CHAR_DATA *)0x0);
        }
        else {
          bVar1 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0)
                          ,(CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
          if (!bVar1) {
            WAIT_STATE(ch_00,(int)((ulong)ch_01 >> 0x20));
            iVar2 = number_percent();
            iVar3 = get_skill(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc);
            if (iVar3 < iVar2) {
              send_to_char((char *)ch_00,ch_01);
              check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                            (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
            }
            else {
              LAG_CHAR((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),
                       in_stack_ffffffffffffedcc);
              act((char *)ch_00,ch_01,(void *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),
                  (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
              act((char *)ch_00,ch_01,(void *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),
                  (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
              act((char *)ch_00,ch_01,(void *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),
                  (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
              fBoth = (undefined1)((uint)in_stack_ffffffffffffedcc >> 0x18);
              check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                            (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
              stop_fighting((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),(bool)fBoth);
              stop_fighting((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),(bool)fBoth);
              set_fighting(fch,in_stack_00000008);
              set_fighting(fch,in_stack_00000008);
            }
          }
        }
      }
      else {
        send_to_char((char *)ch_00,in_stack_ffffffffffffedd8);
      }
    }
  }
  return;
}

Assistant:

void do_rescue(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *fch;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Rescue whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("What about fleeing instead?\n\r", ch);
		return;
	}

	if (!is_npc(ch) && is_npc(victim))
	{
		send_to_char("Doesn't need your help!\n\r", ch);
		return;
	}

	fch = victim->fighting;

	if (fch == nullptr)
	{
		send_to_char("That person is not fighting right now.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim->fighting))
		return;

	WAIT_STATE(ch, skill_table[gsn_rescue].beats);

	if (number_percent() > get_skill(ch, gsn_rescue))
	{
		send_to_char("You fail the rescue.\n\r", ch);
		check_improve(ch, gsn_rescue, false, 1);
		return;
	}

	LAG_CHAR(victim, PULSE_VIOLENCE);
	act("You rescue $N!", ch, nullptr, victim, TO_CHAR);
	act("$n rescues you!", ch, nullptr, victim, TO_VICT);
	act("$n rescues $N!", ch, nullptr, victim, TO_NOTVICT);
	check_improve(ch, gsn_rescue, true, 1);

	stop_fighting(fch, false);
	stop_fighting(victim, false);

	set_fighting(ch, fch);
	set_fighting(fch, ch);
}